

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

int __thiscall ghc::filesystem::rename(filesystem *this,char *__old,char *__new)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  
  uVar2 = std::_V2::system_category();
  __new[0] = '\0';
  __new[1] = '\0';
  __new[2] = '\0';
  __new[3] = '\0';
  *(undefined8 *)(__new + 8) = uVar2;
  iVar1 = path::compare((path *)this,(path *)__old);
  if (iVar1 != 0) {
    iVar1 = ::rename(*(char **)this,*(char **)__old);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      *(int *)__new = iVar1;
      *(undefined8 *)(__new + 8) = uVar2;
    }
  }
  return iVar1;
}

Assistant:

GHC_INLINE void rename(const path& from, const path& to, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (from != to) {
        if (!MoveFileExW(GHC_NATIVEWP(from), GHC_NATIVEWP(to), (DWORD)MOVEFILE_REPLACE_EXISTING)) {
            ec = detail::make_system_error();
        }
    }
#else
    if (from != to) {
        if (::rename(from.c_str(), to.c_str()) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}